

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

CHAR_DATA * get_rand_from_room(ROOM_INDEX_DATA *room)

{
  int iVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *pCVar3;
  int iVar4;
  
  iVar4 = 0;
  pCVar2 = (CHAR_DATA *)0x0;
  for (pCVar3 = room->people; pCVar3 != (CHAR_DATA *)0x0; pCVar3 = pCVar3->next_in_room) {
    iVar1 = number_percent();
    if (iVar4 < iVar1) {
      iVar4 = iVar1;
      pCVar2 = pCVar3;
    }
  }
  return pCVar2;
}

Assistant:

CHAR_DATA *get_rand_from_room(ROOM_INDEX_DATA *room)
{
	CHAR_DATA *vch, *victim = nullptr;
	int now = 0, highest = 0;

	for (vch = room->people; vch; vch = vch->next_in_room)
	{
		if ((now = number_percent()) > highest)
		{
			victim = vch;
			highest = now;
		}
	}

	return victim;
}